

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O3

void sexp_mark_one(sexp_conflict ctx,sexp_conflict *types,sexp_conflict x)

{
  sexp_mark_stack_ptr_t *psVar1;
  sexp_mark_stack_ptr_t **ppsVar2;
  sexp_conflict psVar3;
  sexp_mark_stack_ptr_t *psVar4;
  uint uVar5;
  sexp_mark_stack_ptr_t *psVar6;
  long lVar7;
  sexp_conflict *ppsVar8;
  sexp_conflict *ppsVar9;
  sexp_gc_var_t *psVar10;
  sexp_mark_stack_ptr_t **ptr;
  sexp_conflict *ppsVar11;
  sexp_mark_stack_ptr_t *stack;
  
  if (((ulong)x & 3) == 0 && x != (sexp_conflict)0x0) {
    psVar1 = (ctx->value).context.mark_stack;
    ppsVar2 = &(ctx->value).context.mark_stack_ptr;
    while (x->markedp == '\0') {
      x->markedp = '\x01';
      uVar5 = x->tag;
      if (uVar5 == 0x24) {
        psVar10 = (x->value).context.saves;
        if (psVar10 == (sexp_gc_var_t *)0x0) {
          uVar5 = 0x24;
        }
        else {
          do {
            if (psVar10->var != (sexp_conflict *)0x0) {
              sexp_mark_one(ctx,types,*psVar10->var);
            }
            psVar10 = psVar10->next;
          } while (psVar10 != (sexp_gc_var_t *)0x0);
          uVar5 = x->tag;
        }
      }
      psVar3 = types[uVar5];
      lVar7 = (long)(psVar3->value).type.field_len_base +
              (ulong)(psVar3->value).type.field_len_scale *
              *(long *)((long)&x->tag + (long)(psVar3->value).type.field_len_off) + -1;
      if (lVar7 < 0) {
        return;
      }
      ppsVar11 = (sexp_conflict *)((long)&x->tag + (long)(psVar3->value).type.field_base);
      ppsVar8 = ppsVar11 + lVar7;
      if (lVar7 != 0) {
        do {
          psVar3 = *ppsVar8;
          if ((((ulong)psVar3 & 3) == 0 && psVar3 != (sexp_conflict)0x0) &&
             (psVar3->markedp == '\0')) break;
          ppsVar8 = ppsVar8 + -1;
        } while (ppsVar11 < ppsVar8);
      }
      do {
        ppsVar9 = ppsVar8;
        if (ppsVar9 <= ppsVar11) goto LAB_0010ce75;
        ppsVar8 = ppsVar9 + -1;
      } while (*ppsVar9 == ppsVar9[-1]);
      psVar4 = *ppsVar2;
      psVar6 = psVar1;
      if ((psVar4 != (sexp_mark_stack_ptr_t *)0x0) &&
         (psVar6 = psVar4 + 1, psVar4 < psVar1 || ppsVar2 <= psVar6)) {
        psVar6 = (sexp_mark_stack_ptr_t *)malloc(0x18);
      }
      *ppsVar2 = psVar6;
      psVar6->start = ppsVar11;
      (*ppsVar2)->end = ppsVar9;
      (*ppsVar2)->prev = psVar4;
LAB_0010ce75:
      x = *ppsVar9;
      if (x == (sexp_conflict)0x0) {
        return;
      }
      if (((ulong)x & 3) != 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

static void sexp_mark_one (sexp ctx, sexp* types, sexp x) {
  sexp_sint_t len;
  sexp t, *p, *q;
  struct sexp_gc_var_t *saves;
 loop:
  if (!x || !sexp_pointerp(x) || !sexp_valid_object_p(ctx, x) || sexp_markedp(x))
    return;
  sexp_markedp(x) = 1;
  if (sexp_contextp(x)) {
    for (saves=sexp_context_saves(x); saves; saves=saves->next)
      if (saves->var) sexp_mark_one(ctx, types, *(saves->var));
  }
  t = types[sexp_pointer_tag(x)];
  len = sexp_type_num_slots_of_object(t, x) - 1;
  if (len >= 0) {
    p = (sexp*) (((char*)x) + sexp_type_field_base(t));
    q = p + len;
    while (p < q && (*q && sexp_pointerp(*q) ? sexp_markedp(*q) : 1))
      q--;                      /* skip trailing immediates */
    while (p < q && *q == q[-1])
      q--;                      /* skip trailing duplicates */
    if (p < q) {
      sexp_mark_stack_push(ctx, p, q);
    }
    x = *q;
    goto loop;
  }
}